

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

FT_Bool Ins_Goto_CodeRange(TT_ExecContext exc,FT_Int aRange,FT_Long aIP)

{
  TT_CodeRange *pTVar1;
  TT_CodeRange *range;
  FT_Long aIP_local;
  FT_Int aRange_local;
  TT_ExecContext exc_local;
  
  if ((aRange < 1) || (3 < aRange)) {
    exc->error = 0x84;
    exc_local._7_1_ = '\x01';
  }
  else {
    pTVar1 = exc->codeRangeTable + (aRange + -1);
    if (pTVar1->base == (FT_Byte *)0x0) {
      exc->error = 0x8a;
      exc_local._7_1_ = '\x01';
    }
    else if (pTVar1->size < aIP) {
      exc->error = 0x83;
      exc_local._7_1_ = '\x01';
    }
    else {
      exc->code = pTVar1->base;
      exc->codeSize = pTVar1->size;
      exc->IP = aIP;
      exc->curRange = aRange;
      exc_local._7_1_ = '\0';
    }
  }
  return exc_local._7_1_;
}

Assistant:

static FT_Bool
  Ins_Goto_CodeRange( TT_ExecContext  exc,
                      FT_Int          aRange,
                      FT_Long         aIP )
  {
    TT_CodeRange*  range;


    if ( aRange < 1 || aRange > 3 )
    {
      exc->error = FT_THROW( Bad_Argument );
      return FAILURE;
    }

    range = &exc->codeRangeTable[aRange - 1];

    if ( !range->base )     /* invalid coderange */
    {
      exc->error = FT_THROW( Invalid_CodeRange );
      return FAILURE;
    }

    /* NOTE: Because the last instruction of a program may be a CALL */
    /*       which will return to the first byte *after* the code    */
    /*       range, we test for aIP <= Size, instead of aIP < Size.  */

    if ( aIP > range->size )
    {
      exc->error = FT_THROW( Code_Overflow );
      return FAILURE;
    }

    exc->code     = range->base;
    exc->codeSize = range->size;
    exc->IP       = aIP;
    exc->curRange = aRange;

    return SUCCESS;
  }